

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O3

wchar_t inven_damage(player *p,wchar_t type,wchar_t cperc)

{
  player_body *ppVar1;
  ulong uVar2;
  short sVar3;
  undefined2 uVar4;
  object *poVar5;
  player_upkeep *ppVar6;
  object *poVar7;
  _Bool _Var8;
  char cVar9;
  short sVar10;
  wchar_t wVar11;
  undefined4 uVar12;
  wchar_t wVar13;
  char *pcVar14;
  object *poVar15;
  char *pcVar16;
  wchar_t num;
  long lVar17;
  object *obj;
  char cVar18;
  uint uVar19;
  char *pcVar20;
  _Bool none_left;
  object *destroyed;
  char o_name [80];
  _Bool local_b1;
  wchar_t local_b0;
  wchar_t local_ac;
  player *local_a8;
  long local_a0;
  undefined4 local_98;
  wchar_t local_94;
  object *local_90;
  char local_88 [88];
  
  local_ac = L'\0';
  if (p->gear != (object *)0x0 && L'\0' < cperc) {
    ppVar1 = &p->body;
    lVar17 = (long)type;
    local_94 = (uint)cperc >> 2;
    local_ac = L'\0';
    obj = p->gear;
    local_b0 = cperc;
    local_a8 = p;
    local_a0 = lVar17;
    do {
      poVar5 = obj->next;
      _Var8 = object_is_equipped(*ppVar1,obj);
      poVar15 = poVar5;
      if (((!_Var8) && (obj->artifact == (artifact *)0x0)) &&
         ((obj->el_info[lVar17].flags & 3) == 1)) {
        _Var8 = tval_is_weapon(obj);
        if ((!_Var8) || (_Var8 = tval_is_ammo(obj), _Var8)) {
          _Var8 = tval_is_armor(obj);
          if (_Var8) {
            wVar11 = Rand_div(10000);
            if (wVar11 < cperc) {
              sVar10 = obj->to_a + -1;
              obj->to_a = sVar10;
              lVar17 = 0x46;
              sVar3 = p->obj_k->to_a;
              goto joined_r0x001b01a1;
            }
          }
          else {
            _Var8 = tval_is_rod(obj);
            wVar11 = cperc;
            if (_Var8) {
              wVar11 = local_94;
            }
            p = local_a8;
            if (obj->number != '\0') {
              num = L'\0';
              uVar19 = 0;
              do {
                wVar13 = Rand_div(10000);
                num = num + (uint)(wVar13 < wVar11);
                uVar19 = uVar19 + 1;
              } while (uVar19 < obj->number);
              uVar12 = 0;
              goto LAB_001b021a;
            }
          }
        }
        else {
          wVar11 = Rand_div(10000);
          if (wVar11 < cperc) {
            uVar4 = obj->to_h;
            obj->to_h = uVar4 + -1;
            poVar7 = p->obj_k;
            if (poVar7->to_h != 0) {
              obj->known->to_h = uVar4 + -1;
            }
            sVar10 = obj->to_d + -1;
            obj->to_d = sVar10;
            lVar17 = 0x4a;
            sVar3 = poVar7->to_d;
joined_r0x001b01a1:
            if (sVar3 != 0) {
              *(short *)(obj->known->flags + lVar17 + -0x4c) = sVar10;
            }
            ppVar6 = p->upkeep;
            uVar2._0_4_ = ppVar6->update;
            uVar2._4_4_ = ppVar6->redraw;
            ppVar6->update = (int)(uVar2 | 0x4000000000001);
            ppVar6->redraw = (int)((uVar2 | 0x4000000000001) >> 0x20);
            num = (wchar_t)obj->number;
            uVar12 = (undefined4)CONCAT71((int7)((ulong)ppVar6 >> 8),1);
LAB_001b021a:
            lVar17 = local_a0;
            p = local_a8;
            cperc = local_b0;
            if (num != L'\0') {
              local_b1 = false;
              local_98 = uVar12;
              object_desc(local_88,0x50,obj,0,local_a8);
              pcVar20 = "Y";
              if (((1 < obj->number) && (pcVar20 = "All of y", num != (uint)obj->number)) &&
                 (pcVar20 = "One of y", L'\x01' < num)) {
                pcVar20 = "Some of y";
              }
              cVar9 = gear_to_label(local_a8,obj);
              pcVar16 = "was";
              if (L'\x01' < num) {
                pcVar16 = "were";
              }
              cVar18 = (char)local_98;
              pcVar14 = "destroyed";
              if (cVar18 != '\0') {
                pcVar14 = "damaged";
              }
              msgt(0x21,"%sour %s (%c) %s %s!",pcVar20,local_88,(ulong)(uint)(int)cVar9,pcVar16,
                   pcVar14);
              p = local_a8;
              poVar15 = obj;
              lVar17 = local_a0;
              cperc = local_b0;
              if (cVar18 == '\0') {
                local_90 = gear_object_for_use(local_a8,obj,num,false,&local_b1);
                if (local_90->known != (object *)0x0) {
                  object_delete((chunk *)0x0,(chunk *)0x0,&local_90->known);
                }
                object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
                local_ac = local_ac + num;
                poVar15 = poVar5;
                lVar17 = local_a0;
                cperc = local_b0;
              }
            }
          }
        }
      }
      obj = poVar15;
    } while (poVar15 != (object *)0x0);
  }
  return local_ac;
}

Assistant:

int inven_damage(struct player *p, int type, int cperc)
{
	int j, k, amt;
	struct object *obj = p->gear;
	char o_name[80];
	bool damage;

	/* No chance means no damage */
	if (cperc <= 0)
		return 0;

	/* Count the casualties */
	k = 0;

	/* Scan through the gear */
	while (obj) {
		struct object *next = obj->next;
		if (object_is_equipped(p->body, obj)) {
			obj = next;
			continue;
		}

		/* Hack -- for now, skip artifacts */
		if (obj->artifact) {
			obj = next;
			continue;
		}

		/* Give this item slot a shot at death if it is vulnerable */
		if ((obj->el_info[type].flags & EL_INFO_HATES) &&
			!(obj->el_info[type].flags & EL_INFO_IGNORE)) {
			/* Chance to destroy this item */
			int chance = cperc;

			/* Track if it is damaged instead of destroyed */
			damage = false;

			/* Analyze the type to see if we just damage it
			 * - we also check for rods to reduce chance */
			if (tval_is_weapon(obj) && !tval_is_ammo(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_h--;
					if (p->obj_k->to_h)
						obj->known->to_h = obj->to_h;
					obj->to_d--;
					if (p->obj_k->to_d)
						obj->known->to_d = obj->to_d;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_armor(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_a--;
					if (p->obj_k->to_a)
						obj->known->to_a = obj->to_a;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_rod(obj)) {
				chance = (chance / 4);
			}


			/* Damage instead of destroy */
			if (damage) {
				p->upkeep->update |= (PU_BONUS);
				p->upkeep->redraw |= (PR_EQUIP);

				/* Casualty count */
				amt = obj->number;
			} else
				/* ... or count the casualties */
				for (amt = j = 0; j < obj->number; ++j)
					if (randint0(10000) < chance) amt++;

			/* Some casualities */
			if (amt) {
				struct object *destroyed;
				bool none_left = false;

				/* Get a description */
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_BASE, p);

				/* Message */
				msgt(MSG_DESTROY, "%sour %s (%c) %s %s!",
				           ((obj->number > 1) ?
				            ((amt == obj->number) ? "All of y" :
				             (amt > 1 ? "Some of y" : "One of y")) : "Y"),
				           o_name, gear_to_label(p, obj),
				           ((amt > 1) ? "were" : "was"),
					   (damage ? "damaged" : "destroyed"));

				/* Damage already done? */
				if (damage)
					continue;

				/* Destroy "amt" items */
				destroyed = gear_object_for_use(p, obj, amt,
					false, &none_left);
				if (destroyed->known)
					object_delete(NULL, NULL, &destroyed->known);
				object_delete(NULL, NULL, &destroyed);

				/* Count the casualties */
				k += amt;
			}
		}
		obj = next;
	}

	/* Return the casualty count */
	return (k);
}